

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O2

void nghttp2_map_each_free(nghttp2_map *map,_func_int_void_ptr_void_ptr *func,void *ptr)

{
  void *pvVar1;
  long lVar2;
  uint32_t i;
  ulong uVar3;
  
  lVar2 = 8;
  for (uVar3 = 0; uVar3 < map->tablelen; uVar3 = uVar3 + 1) {
    pvVar1 = *(void **)((long)&map->table->hash + lVar2);
    if (pvVar1 != (void *)0x0) {
      (*func)(pvVar1,ptr);
    }
    lVar2 = lVar2 + 0x10;
  }
  return;
}

Assistant:

void nghttp2_map_each_free(nghttp2_map *map, int (*func)(void *data, void *ptr),
                           void *ptr) {
  uint32_t i;
  nghttp2_map_bucket *bkt;

  for (i = 0; i < map->tablelen; ++i) {
    bkt = &map->table[i];

    if (bkt->data == NULL) {
      continue;
    }

    func(bkt->data, ptr);
  }
}